

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll_set.cpp
# Opt level: O2

void __thiscall miniros::PollSet::PollSet(PollSet *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  TransportPtr local_48;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  (this->socket_info_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->socket_info_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->socket_info_)._M_t._M_impl.super__Rb_tree_header;
  (this->socket_info_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->socket_info_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->socket_info_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->socket_info_mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->socket_info_mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->socket_info_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->socket_info_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->socket_info_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->sockets_changed_ = false;
  (this->just_deleted_mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->just_deleted_mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->just_deleted_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->just_deleted_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->just_deleted_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->just_deleted_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->just_deleted_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->just_deleted_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ufds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->ufds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->ufds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->signal_mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->signal_mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->signal_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->signal_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->signal_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  iVar2 = create_socket_watcher();
  this->epfd_ = iVar2;
  iVar2 = create_signal_pair(this->signal_pipe_);
  if (iVar2 != 0) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (PollSet::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_38._M_pod_data,"miniros.poll_set",(allocator<char> *)&local_48);
      console::initializeLogLocation(&PollSet::loc,(string *)&local_38,Fatal);
      std::__cxx11::string::~string((string *)local_38._M_pod_data);
    }
    if (PollSet::loc.level_ != Fatal) {
      console::setLogLocationLevel(&PollSet::loc,Fatal);
      console::checkLogLocationEnabled(&PollSet::loc);
    }
    if (PollSet::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,PollSet::loc.logger_,PollSet::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/poll_set.cpp"
                     ,0x37,"miniros::PollSet::PollSet()","create_signal_pair() failed");
    }
  }
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/poll_set.cpp:58:30)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/poll_set.cpp:58:30)>
             ::_M_manager;
  local_48.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38._M_unused._M_object = this;
  addSocket(this,this->signal_pipe_[0],(SocketUpdateFunc *)&local_38,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  addEvents(this,this->signal_pipe_[0],1);
  return;
}

Assistant:

PollSet::PollSet()
    : sockets_changed_(false), epfd_(create_socket_watcher())
{
  if ( create_signal_pair(signal_pipe_) != 0 ) {
    MINIROS_FATAL("create_signal_pair() failed");
    MINIROS_BREAK();
  }
  addSocket(signal_pipe_[0], [this](int events){this->onLocalPipeEvents(events);});
  addEvents(signal_pipe_[0], POLLIN);
}